

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O1

REF_STATUS
ref_geom_cell_tuv(REF_GEOM ref_geom,REF_INT node,REF_INT *nodes,REF_INT type,REF_DBL *param,
                 REF_INT *sens)

{
  REF_INT RVar1;
  REF_INT id;
  int iVar2;
  REF_INT *pRVar3;
  REF_DBL *pRVar4;
  double dVar5;
  long lVar6;
  REF_GEOM pRVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  undefined8 uVar11;
  char *pcVar12;
  ulong uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  double dVar16;
  REF_INT from_geom;
  double trange [2];
  double uv [2];
  REF_INT geom;
  double uvtmin [2];
  double uvtmax [2];
  REF_DBL local_d8;
  double dStack_d0;
  REF_GEOM local_c0;
  int local_b4;
  undefined8 local_b0;
  ulong local_a8;
  REF_DBL *local_a0;
  double local_98;
  double local_90;
  long local_80;
  double local_78;
  double local_70;
  int local_5c;
  REF_DBL local_58;
  double local_50;
  double local_48;
  double local_40;
  
  if (type - 1U < 2) {
    RVar1 = nodes[(ulong)(uint)type + 1];
    uVar13 = (ulong)(type + 1);
    uVar9 = 0xffffffff;
    uVar10 = 0;
    do {
      local_a0 = param;
      if (nodes[uVar10] == node) {
        if (uVar9 != 0xffffffff) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x302,"ref_geom_cell_tuv","node found twice in nodes",0xffffffffffffffff,
                 (long)(int)uVar9);
          return 1;
        }
        uVar9 = (uint)uVar10;
      }
      uVar10 = uVar10 + 1;
    } while (uVar13 != uVar10);
    if (uVar9 == 0xffffffff) {
      pcVar12 = "node not found in nodes";
      uVar11 = 0x306;
    }
    else {
      local_a8 = CONCAT44(local_a8._4_4_,type - 1U);
      uVar8 = ref_geom_find(ref_geom,node,type,RVar1,&local_5c);
      local_c0 = ref_geom;
      if (uVar8 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x30b,"ref_geom_cell_tuv",(ulong)uVar8,"not found");
        printf(" %d type %d id\n",(ulong)(uint)type,RVar1);
        ref_geom_tattle(ref_geom,node);
        return uVar8;
      }
      pRVar3 = ref_geom->descr;
      local_b0 = (long)local_5c;
      lVar6 = local_b0 * 6;
      if ((pRVar3[local_b0 * 6 + 3] == 0) && (pRVar3[local_b0 * 6 + 4] == 0)) {
        pRVar4 = ref_geom->param;
        *local_a0 = pRVar4[local_b0 * 2];
        if (1 < type) {
          local_a0[1] = pRVar4[(int)(local_5c * 2 | 1)];
        }
        *sens = 0;
        return 0;
      }
      if ((int)local_a8 == 0) {
        uVar8 = ref_egads_edge_trange(ref_geom,RVar1,&local_98);
        if (uVar8 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x317,"ref_geom_cell_tuv",(ulong)uVar8,"trange");
          return uVar8;
        }
        uVar9 = ref_geom_tuv(ref_geom,nodes[(int)(1 - uVar9)],type,RVar1,&local_78);
        if (uVar9 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x319,"ref_geom_cell_tuv",(ulong)uVar9,"from tuv");
          return uVar9;
        }
        if ((0.0 <= local_78 - local_98) && (0.0 <= local_90 - local_78)) {
          if (local_78 - local_98 < local_90 - local_78) {
            *sens = 1;
            *local_a0 = local_98;
            return 0;
          }
          *sens = -1;
          *local_a0 = local_90;
          return 0;
        }
        printf(" from t = %e %e %e, dist = %e %e\n");
        pcVar12 = "from node not in trange";
        uVar11 = 799;
      }
      else {
        local_80 = lVar6;
        if (pRVar3[local_b0 * 6 + 4] == 0) {
          local_a8 = (ulong)uVar9;
          local_b0._4_4_ = local_5c >> 0x1f;
          local_b0._0_4_ = -1;
          uVar10 = 0;
          do {
            uVar8 = ref_geom_find(local_c0,nodes[uVar10],type,RVar1,&local_b4);
            pRVar7 = local_c0;
            if (uVar8 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0x32e,"ref_geom_cell_tuv",(ulong)uVar8,"not found");
              return uVar8;
            }
            if (local_a8 != uVar10) {
              if ((local_c0->descr[(long)local_b4 * 6 + 3] == 0) &&
                 (local_c0->descr[(long)local_b4 * 6 + 4] == 0)) {
                local_b0._0_4_ = nodes[uVar10];
              }
            }
            uVar10 = uVar10 + 1;
          } while (uVar13 != uVar10);
          if ((REF_INT)local_b0 == -1) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x33a,"ref_geom_cell_tuv","can\'t find from tuv in tri cell");
            ref_geom_tattle(pRVar7,*nodes);
            ref_geom_tattle(pRVar7,nodes[1]);
            ref_geom_tattle(pRVar7,nodes[2]);
            printf("faceid %d node %d node_index %d\n",RVar1,(ulong)(uint)node,(ulong)uVar9);
            return 1;
          }
          id = local_c0->descr[local_80 + 3];
          uVar9 = ref_geom_tuv(local_c0,(REF_INT)local_b0,2,RVar1,&local_78);
          if (uVar9 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x33c,"ref_geom_cell_tuv",(ulong)uVar9,"from uv");
            return uVar9;
          }
          uVar9 = ref_geom_tuv(pRVar7,node,1,id,&local_58);
          if (uVar9 == 0) {
            uVar9 = ref_egads_edge_face_uv(pRVar7,id,RVar1,1,local_58,&local_d8);
            if (uVar9 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0x33e,"ref_geom_cell_tuv",(ulong)uVar9,"uv 1");
              return uVar9;
            }
            uVar9 = ref_egads_edge_face_uv(pRVar7,id,RVar1,-1,local_58,&local_98);
            if (uVar9 == 0) {
              local_c0 = (REF_GEOM)local_78;
              dVar16 = (dStack_d0 - local_70) * (dStack_d0 - local_70) +
                       (local_d8 - local_78) * (local_d8 - local_78);
              if (dVar16 < 0.0) {
                dVar16 = sqrt(dVar16);
              }
              else {
                dVar16 = SQRT(dVar16);
              }
              dVar5 = (local_90 - local_70) * (local_90 - local_70) +
                      (local_98 - (double)local_c0) * (local_98 - (double)local_c0);
              if (dVar5 < 0.0) {
                dVar5 = sqrt(dVar5);
              }
              else {
                dVar5 = SQRT(dVar5);
              }
              if (dVar5 <= dVar16) {
                *sens = -1;
                *local_a0 = local_98;
                uVar14 = SUB84(local_90,0);
                uVar15 = (undefined4)((ulong)local_90 >> 0x20);
              }
              else {
                *sens = 1;
                *local_a0 = local_d8;
                uVar14 = SUB84(dStack_d0,0);
                uVar15 = (undefined4)((ulong)dStack_d0 >> 0x20);
              }
              local_a0[1] = (REF_DBL)CONCAT44(uVar15,uVar14);
              return 0;
            }
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x33f,"ref_geom_cell_tuv",(ulong)uVar9,"uv -1");
            return uVar9;
          }
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x33d,"ref_geom_cell_tuv",(ulong)uVar9,"edge t0");
          return uVar9;
        }
        local_d8 = 0.0;
        dStack_d0 = 0.0;
        uVar10 = 0;
        local_a8 = local_a8 & 0xffffffff00000000;
        do {
          uVar9 = ref_geom_find(local_c0,nodes[uVar10],type,RVar1,&local_b4);
          if (uVar9 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x351,"ref_geom_cell_tuv",(ulong)uVar9,"not found");
            return uVar9;
          }
          if ((local_c0->descr[(long)local_b4 * 6 + 3] == 0) &&
             (local_c0->descr[(long)local_b4 * 6 + 4] == 0)) {
            uVar9 = ref_geom_tuv(local_c0,nodes[uVar10],2,RVar1,&local_78);
            if (uVar9 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0x355,"ref_geom_cell_tuv",(ulong)uVar9,"from uv");
              return uVar9;
            }
            local_d8 = local_78 + local_d8;
            dStack_d0 = local_70 + dStack_d0;
            local_a8 = CONCAT44(local_a8._4_4_,(int)local_a8 + 1);
          }
          pRVar7 = local_c0;
          uVar10 = uVar10 + 1;
        } while (uVar13 != uVar10);
        if (0 < (int)local_a8) {
          local_d8 = local_d8 / (double)(int)local_a8;
          dStack_d0 = dStack_d0 / (double)(int)local_a8;
          *sens = 0;
          iVar2 = local_c0->descr[local_80 + 4];
          RVar1 = -iVar2;
          if (0 < iVar2) {
            RVar1 = iVar2;
          }
          uVar9 = ref_egads_edge_trange(local_c0,RVar1,&local_98);
          if (uVar9 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x361,"ref_geom_cell_tuv",(ulong)uVar9,"trange");
            return uVar9;
          }
          uVar8 = (uint)local_80 | 1;
          uVar9 = ref_egads_edge_face_uv
                            (pRVar7,RVar1,pRVar7->descr[(int)uVar8],*sens,local_98,&local_58);
          if (uVar9 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x365,"ref_geom_cell_tuv",(ulong)uVar9,"uv t min");
            return uVar9;
          }
          uVar9 = ref_egads_edge_face_uv
                            (pRVar7,RVar1,pRVar7->descr[(int)uVar8],*sens,local_90,&local_48);
          if (uVar9 == 0) {
            if (pRVar7->descr[local_80 + 4] < 1) {
              uVar14 = SUB84(local_d8,0);
              uVar15 = (undefined4)((ulong)local_d8 >> 0x20);
              *local_a0 = local_d8;
              dVar16 = local_58;
              if (local_48 <= local_58) {
                dVar16 = local_48;
              }
              if (local_d8 <= dVar16) {
                uVar14 = SUB84(dVar16,0);
                uVar15 = (undefined4)((ulong)dVar16 >> 0x20);
              }
              if (local_58 <= local_48) {
                local_58 = local_48;
              }
              if (local_58 <= (double)CONCAT44(uVar15,uVar14)) {
                uVar14 = SUB84(local_58,0);
                uVar15 = (undefined4)((ulong)local_58 >> 0x20);
              }
              *local_a0 = (REF_DBL)CONCAT44(uVar15,uVar14);
              uVar14 = SUB84(pRVar7->param[(int)local_b0 * 2 + 1],0);
              uVar15 = (undefined4)((ulong)pRVar7->param[(int)local_b0 * 2 + 1] >> 0x20);
            }
            else {
              *local_a0 = pRVar7->param[local_b0 * 2];
              uVar14 = SUB84(dStack_d0,0);
              uVar15 = (undefined4)((ulong)dStack_d0 >> 0x20);
              local_a0[1] = dStack_d0;
              dVar16 = local_50;
              if (local_40 <= local_50) {
                dVar16 = local_40;
              }
              if (dStack_d0 <= dVar16) {
                uVar14 = SUB84(dVar16,0);
                uVar15 = (undefined4)((ulong)dVar16 >> 0x20);
              }
              if (local_50 <= local_40) {
                local_50 = local_40;
              }
              if (local_50 <= (double)CONCAT44(uVar15,uVar14)) {
                uVar14 = SUB84(local_50,0);
                uVar15 = (undefined4)((ulong)local_50 >> 0x20);
              }
            }
            local_a0[1] = (REF_DBL)CONCAT44(uVar15,uVar14);
            return 0;
          }
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x369,"ref_geom_cell_tuv",(ulong)uVar9,"uv t max");
          return uVar9;
        }
        pcVar12 = "no seed uv found for DEGEN";
        uVar11 = 0x35b;
      }
    }
  }
  else {
    pcVar12 = "type not allowed";
    uVar11 = 0x2fc;
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar11,
         "ref_geom_cell_tuv",pcVar12);
  return 1;
}

Assistant:

REF_FCN REF_STATUS ref_geom_cell_tuv(REF_GEOM ref_geom, REF_INT node,
                                     REF_INT *nodes, REF_INT type,
                                     REF_DBL *param, REF_INT *sens) {
  REF_INT node_per;
  REF_INT id, edgeid, geom, from, from_geom;
  REF_INT node_index, cell_node;
  double trange[2], uv[2], uv0[2], uv1[2], uvtmin[2], uvtmax[2];
  REF_DBL from_param[2], t;
  REF_DBL dist0, dist1;
  REF_INT hits;

  RAS(1 <= type && type <= 2, "type not allowed");
  node_per = type + 1;
  id = nodes[node_per];
  node_index = REF_EMPTY;
  for (cell_node = 0; cell_node < node_per; cell_node++) {
    if (node == nodes[cell_node]) {
      REIS(REF_EMPTY, node_index, "node found twice in nodes");
      node_index = cell_node;
    }
  }
  RAS(REF_EMPTY != node_index, "node not found in nodes");

  RSB(ref_geom_find(ref_geom, node, type, id, &geom), "not found", {
    printf(" %d type %d id\n", type, id);
    ref_geom_tattle(ref_geom, node);
  });

  if (0 == ref_geom_jump(ref_geom, geom) &&
      0 == ref_geom_degen(ref_geom, geom)) {
    if (type > 0) param[0] = ref_geom_param(ref_geom, 0, geom);
    if (type > 1) param[1] = ref_geom_param(ref_geom, 1, geom);
    *sens = 0;
    return REF_SUCCESS;
  }

  switch (type) {
    case REF_GEOM_EDGE:
      RSS(ref_egads_edge_trange(ref_geom, id, trange), "trange");
      from = nodes[1 - node_index];
      RSS(ref_geom_tuv(ref_geom, from, type, id, from_param), "from tuv");
      dist0 = from_param[0] - trange[0];
      dist1 = trange[1] - from_param[0];
      if (dist0 < 0.0 || dist1 < 0.0) {
        printf(" from t = %e %e %e, dist = %e %e\n", trange[0], from_param[0],
               trange[1], dist0, dist1);
        THROW("from node not in trange");
      }
      if (dist0 < dist1) {
        *sens = 1;
        param[0] = trange[0];
      } else {
        *sens = -1;
        param[0] = trange[1];
      }
      break;
    case REF_GEOM_FACE:
      if (0 == ref_geom_degen(ref_geom, geom)) {
        from = REF_EMPTY;
        for (cell_node = 0; cell_node < node_per; cell_node++) {
          RSS(ref_geom_find(ref_geom, nodes[cell_node], type, id, &from_geom),
              "not found");
          if (node_index != cell_node &&
              0 == ref_geom_jump(ref_geom, from_geom) &&
              0 == ref_geom_degen(ref_geom, from_geom)) {
            from = nodes[cell_node];
          }
        }
        RAB(REF_EMPTY != from, "can't find from tuv in tri cell", {
          ref_geom_tattle(ref_geom, nodes[0]);
          ref_geom_tattle(ref_geom, nodes[1]);
          ref_geom_tattle(ref_geom, nodes[2]);
          printf("faceid %d node %d node_index %d\n", id, node, node_index);
        });
        edgeid = ref_geom_jump(ref_geom, geom);
        RSS(ref_geom_tuv(ref_geom, from, REF_GEOM_FACE, id, uv), "from uv");
        RSS(ref_geom_tuv(ref_geom, node, REF_GEOM_EDGE, edgeid, &t), "edge t0");
        RSS(ref_egads_edge_face_uv(ref_geom, edgeid, id, 1, t, uv0), "uv 1");
        RSS(ref_egads_edge_face_uv(ref_geom, edgeid, id, -1, t, uv1), "uv -1");
        dist0 = sqrt(pow(uv0[0] - uv[0], 2) + pow(uv0[1] - uv[1], 2));
        dist1 = sqrt(pow(uv1[0] - uv[0], 2) + pow(uv1[1] - uv[1], 2));
        if (dist0 < dist1) {
          *sens = 1;
          param[0] = uv0[0];
          param[1] = uv0[1];
        } else {
          *sens = -1;
          param[0] = uv1[0];
          param[1] = uv1[1];
        }
      } else {
        uv0[0] = 0.0;
        uv0[1] = 0.0;
        hits = 0;
        for (cell_node = 0; cell_node < node_per; cell_node++) {
          RSS(ref_geom_find(ref_geom, nodes[cell_node], type, id, &from_geom),
              "not found");
          if (0 == ref_geom_jump(ref_geom, from_geom) &&
              0 == ref_geom_degen(ref_geom, from_geom)) {
            RSS(ref_geom_tuv(ref_geom, nodes[cell_node], REF_GEOM_FACE, id, uv),
                "from uv");
            uv0[0] += uv[0];
            uv0[1] += uv[1];
            hits++;
          }
        }
        RAS(0 < hits, "no seed uv found for DEGEN");
        uv0[0] /= (REF_DBL)hits;
        uv0[1] /= (REF_DBL)hits;

        *sens = 0;
        edgeid = ABS(ref_geom_degen(ref_geom, geom));
        RSS(ref_egads_edge_trange(ref_geom, edgeid, trange), "trange");
        RSS(ref_egads_edge_face_uv(ref_geom, edgeid,
                                   ref_geom_id(ref_geom, geom), *sens,
                                   trange[0], uvtmin),
            "uv t min");
        RSS(ref_egads_edge_face_uv(ref_geom, edgeid,
                                   ref_geom_id(ref_geom, geom), *sens,
                                   trange[1], uvtmax),
            "uv t max");
        /* edgeid sign convention defined in ref_geom_mark_jump_degen */
        if (0 < ref_geom_degen(ref_geom, geom)) {
          param[0] = ref_geom_param(ref_geom, 0, geom);
          param[1] = uv0[1];
          param[1] = MAX(param[1], MIN(uvtmin[1], uvtmax[1]));
          param[1] = MIN(param[1], MAX(uvtmin[1], uvtmax[1]));
        } else {
          param[0] = uv0[0];
          param[0] = MAX(param[0], MIN(uvtmin[0], uvtmax[0]));
          param[0] = MIN(param[0], MAX(uvtmin[0], uvtmax[0]));
          param[1] = ref_geom_param(ref_geom, 1, geom);
        }
      }
      break;
    default:
      RSS(REF_IMPLEMENT, "can't to geom type yet");
  }

  return REF_SUCCESS;
}